

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void initialization_suite::init_one(void)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  iterator iVar1;
  iterator iVar2;
  allocator_type local_b5;
  int local_b4;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  
  array._M_elems[0] = 0xb;
  array._M_elems[1] = 0x16;
  array._M_elems[2] = 0x21;
  array._M_elems[3] = 0x2c;
  span.member.cap = 4;
  span.member.size = 1;
  span.member.next = 1;
  local_b4 = 0xb;
  __l._M_len = 1;
  __l._M_array = &local_b4;
  span.member.data = array._M_elems;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_b5);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x91f,"void initialization_suite::init_one()",iVar1,iVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  span.member.cap = 4;
  span.member.size = 1;
  span.member.next = 2;
  local_b4 = 0x16;
  __l_00._M_len = 1;
  __l_00._M_array = &local_b4;
  span.member.data = array._M_elems;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_00,&local_b5);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x926,"void initialization_suite::init_one()",iVar1,iVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  span.member.cap = 4;
  span.member.size = 1;
  span.member.next = 3;
  local_b4 = 0x21;
  __l_01._M_len = 1;
  __l_01._M_array = &local_b4;
  span.member.data = array._M_elems;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_01,&local_b5);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x92d,"void initialization_suite::init_one()",iVar1,iVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  span.member.cap = 4;
  span.member.size = 1;
  span.member.next = 4;
  local_b4 = 0x2c;
  __l_02._M_len = 1;
  __l_02._M_array = &local_b4;
  span.member.data = array._M_elems;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_02,&local_b5);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x934,"void initialization_suite::init_one()",iVar1,iVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void init_one()
{
    std::array<int, 4> array = { 11, 22, 33, 44 };
    {
        circular_view<int> span(array.begin(), array.end(), array.begin(), 1);

        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        circular_view<int> span(array.begin(), array.end(), std::next(array.begin(), 1), 1);

        std::vector<int> expect = { 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        circular_view<int> span(array.begin(), array.end(), std::next(array.begin(), 2), 1);

        std::vector<int> expect = { 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        circular_view<int> span(array.begin(), array.end(), std::next(array.begin(), 3), 1);

        std::vector<int> expect = { 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}